

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

Bac_Man_t * Bac_ManCollapse(Bac_Man_t *p)

{
  int iVar1;
  int iVar2;
  int nOuts;
  int nObjs;
  Vec_Int_t *p_00;
  Bac_Man_t *p_01;
  Bac_Ntk_t *p_02;
  Bac_Ntk_t *pNew_00;
  Bac_Ntk_t *pRootNew;
  Bac_Ntk_t *pRoot;
  Bac_Man_t *pNew;
  Vec_Int_t *vSigs;
  int iObj;
  int i;
  Bac_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  p_01 = Bac_ManStart(p,1);
  p_02 = Bac_ManRoot(p);
  pNew_00 = Bac_ManRoot(p_01);
  iVar1 = Bac_NtkNameId(p_02);
  iVar2 = Bac_NtkPiNum(p_02);
  nOuts = Bac_NtkPoNum(p_02);
  nObjs = Bac_ManClpObjNum(p);
  Bac_NtkAlloc(pNew_00,iVar1,iVar2,nOuts,nObjs);
  iVar1 = Vec_IntSize(&p_02->vInfo);
  if (iVar1 != 0) {
    Vec_IntAppend(&pNew_00->vInfo,&p_02->vInfo);
  }
  for (vSigs._4_4_ = 0; iVar1 = Bac_NtkPiNum(p_02), vSigs._4_4_ < iVar1;
      vSigs._4_4_ = vSigs._4_4_ + 1) {
    Bac_NtkPi(p_02,vSigs._4_4_);
    iVar1 = Bac_ObjAlloc(pNew_00,BAC_OBJ_PI,-1);
    Vec_IntPush(p_00,iVar1);
  }
  Bac_NtkCollapse_rec(pNew_00,p_02,p_00);
  iVar1 = Vec_IntSize(p_00);
  iVar2 = Bac_NtkPoNum(p_02);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vSigs) == Bac_NtkPoNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0x244,"Bac_Man_t *Bac_ManCollapse(Bac_Man_t *)");
  }
  for (vSigs._4_4_ = 0; iVar1 = Bac_NtkPoNum(p_02), vSigs._4_4_ < iVar1;
      vSigs._4_4_ = vSigs._4_4_ + 1) {
    Bac_NtkPo(p_02,vSigs._4_4_);
    iVar1 = Vec_IntEntry(p_00,vSigs._4_4_);
    Bac_ObjAlloc(pNew_00,BAC_OBJ_PO,iVar1);
  }
  iVar1 = Bac_NtkObjNum(pNew_00);
  iVar2 = Bac_NtkObjNumAlloc(pNew_00);
  if (iVar1 == iVar2) {
    Vec_IntFree(p_00);
    iVar1 = Bac_NtkHasNames(p_02);
    if (iVar1 != 0) {
      Bac_NtkStartNames(pNew_00);
      for (vSigs._4_4_ = 0; iVar1 = Bac_NtkPiNum(p_02), vSigs._4_4_ < iVar1;
          vSigs._4_4_ = vSigs._4_4_ + 1) {
        iVar1 = Bac_NtkPi(p_02,vSigs._4_4_);
        iVar2 = Bac_NtkPi(pNew_00,vSigs._4_4_);
        iVar1 = Bac_ObjName(p_02,iVar1);
        Bac_ObjSetName(pNew_00,iVar2,iVar1);
      }
      for (vSigs._4_4_ = 0; iVar1 = Bac_NtkPoNum(p_02), vSigs._4_4_ < iVar1;
          vSigs._4_4_ = vSigs._4_4_ + 1) {
        iVar1 = Bac_NtkPo(p_02,vSigs._4_4_);
        iVar1 = Bac_ObjFanin(p_02,iVar1);
        iVar2 = Bac_ObjIsPi(p_02,iVar1);
        if (iVar2 == 0) {
          iVar2 = Bac_ObjCopy(p_02,iVar1);
          iVar1 = Bac_ObjName(p_02,iVar1);
          Bac_ObjSetName(pNew_00,iVar2,iVar1);
        }
      }
    }
    return p_01;
  }
  __assert_fail("Bac_NtkObjNum(pRootNew) == Bac_NtkObjNumAlloc(pRootNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                ,0x247,"Bac_Man_t *Bac_ManCollapse(Bac_Man_t *)");
}

Assistant:

Bac_Man_t * Bac_ManCollapse( Bac_Man_t * p )
{
    int i, iObj;
    Vec_Int_t * vSigs = Vec_IntAlloc( 1000 );
    Bac_Man_t * pNew = Bac_ManStart( p, 1 );
    Bac_Ntk_t * pRoot = Bac_ManRoot( p );
    Bac_Ntk_t * pRootNew = Bac_ManRoot( pNew );
    Bac_NtkAlloc( pRootNew, Bac_NtkNameId(pRoot), Bac_NtkPiNum(pRoot), Bac_NtkPoNum(pRoot), Bac_ManClpObjNum(p) );
    if ( Vec_IntSize(&pRoot->vInfo) )
        Vec_IntAppend( &pRootNew->vInfo, &pRoot->vInfo );
    Bac_NtkForEachPi( pRoot, iObj, i )
        Vec_IntPush( vSigs, Bac_ObjAlloc(pRootNew, BAC_OBJ_PI, -1) );
    Bac_NtkCollapse_rec( pRootNew, pRoot, vSigs );
    assert( Vec_IntSize(vSigs) == Bac_NtkPoNum(pRoot) );
    Bac_NtkForEachPo( pRoot, iObj, i )
        Bac_ObjAlloc( pRootNew, BAC_OBJ_PO, Vec_IntEntry(vSigs, i) );
    assert( Bac_NtkObjNum(pRootNew) == Bac_NtkObjNumAlloc(pRootNew) );
    Vec_IntFree( vSigs );
    // transfer PI/PO names
    if ( Bac_NtkHasNames(pRoot) )
    {
        Bac_NtkStartNames( pRootNew );
        Bac_NtkForEachPi( pRoot, iObj, i )
            Bac_ObjSetName( pRootNew, Bac_NtkPi(pRootNew, i), Bac_ObjName(pRoot, iObj) );
        Bac_NtkForEachPoDriver( pRoot, iObj, i )
            if ( !Bac_ObjIsPi(pRoot, iObj) )
                Bac_ObjSetName( pRootNew, Bac_ObjCopy(pRoot, iObj), Bac_ObjName(pRoot, iObj) );
    }
    return pNew;
}